

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ApiCallback(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Fts5Auxiliary *pAux_00;
  sqlite3_int64 iCsrId_00;
  Fts5Cursor *pCsr_00;
  char *z;
  char *zErr;
  i64 iCsrId;
  Fts5Cursor *pCsr;
  Fts5Auxiliary *pAux;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  pAux_00 = (Fts5Auxiliary *)sqlite3_user_data(context);
  iCsrId_00 = sqlite3_value_int64(*argv);
  pCsr_00 = fts5CursorFromCsrid(pAux_00->pGlobal,iCsrId_00);
  if (pCsr_00 == (Fts5Cursor *)0x0) {
    z = sqlite3_mprintf("no such cursor: %lld",iCsrId_00);
    sqlite3_result_error(context,z,-1);
    sqlite3_free(z);
  }
  else {
    fts5ApiInvoke(pAux_00,pCsr_00,context,argc + -1,argv + 1);
  }
  return;
}

Assistant:

static void fts5ApiCallback(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){

  Fts5Auxiliary *pAux;
  Fts5Cursor *pCsr;
  i64 iCsrId;

  assert( argc>=1 );
  pAux = (Fts5Auxiliary*)sqlite3_user_data(context);
  iCsrId = sqlite3_value_int64(argv[0]);

  pCsr = fts5CursorFromCsrid(pAux->pGlobal, iCsrId);
  if( pCsr==0 ){
    char *zErr = sqlite3_mprintf("no such cursor: %lld", iCsrId);
    sqlite3_result_error(context, zErr, -1);
    sqlite3_free(zErr);
  }else{
    fts5ApiInvoke(pAux, pCsr, context, argc-1, &argv[1]);
  }
}